

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O1

Bool prvTidySetOptionInt(TidyDocImpl *doc,TidyOptionId optId,ulong val)

{
  TidyConfigChangeCallback p_Var1;
  ulong uVar2;
  
  if (optId < N_TIDY_OPTIONS) {
    if (option_defs[optId].type != TidyInteger) {
      __assert_fail("option_defs[ optId ].type == TidyInteger",
                    "/workspace/llm4binary/github/license_c_cmakelists/htacg[P]tidy-html5/src/config.c"
                    ,0x1e6,"Bool prvTidySetOptionInt(TidyDocImpl *, TidyOptionId, ulong)");
    }
    p_Var1 = doc->pConfigChangeCallback;
    if (p_Var1 == (TidyConfigChangeCallback)0x0) {
      (doc->config).value[optId].v = val;
    }
    else {
      uVar2 = (doc->config).value[optId].v;
      (doc->config).value[optId].v = val;
      if (uVar2 != val) {
        (*p_Var1)((TidyDoc)doc,(TidyOption)(option_defs + optId));
      }
    }
  }
  return (Bool)(optId < N_TIDY_OPTIONS);
}

Assistant:

Bool TY_(SetOptionInt)( TidyDocImpl* doc, TidyOptionId optId, ulong val )
{
    Bool status = ( optId < N_TIDY_OPTIONS );
    if ( status )
    {
        assert( option_defs[ optId ].type == TidyInteger );
        SetOptionInteger( doc, optId, val );
    }
    return status;
}